

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O3

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateFullyCoveredAtReference
          (BuiltInsValidator *this,Decoration *decoration,Instruction *built_in_inst,
          Instruction *referenced_inst,Instruction *referenced_from_inst)

{
  uint32_t operand;
  _Rb_tree_color execution_model;
  bool bVar1;
  StorageClass SVar2;
  spv_result_t sVar3;
  _Rb_tree_node_base *p_Var4;
  list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
  *__position;
  undefined8 *puVar5;
  long lVar6;
  DiagnosticStream *pDVar7;
  uint32_t id;
  spv_operand_desc desc;
  uint32_t local_2a4;
  _Any_data local_290;
  code *local_280;
  code *local_278;
  undefined1 local_270 [32];
  string local_250;
  string local_230;
  char *local_210;
  undefined1 local_208 [16];
  _Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
  local_1f8;
  BuiltInsValidator *local_c0;
  
  bVar1 = spvIsVulkanEnv(this->_->context_->target_env);
  if (bVar1) {
    if (decoration->dec_type_ != BuiltIn) {
      __assert_fail("dec_type_ == spv::Decoration::BuiltIn",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/decoration.h"
                    ,0x4f,"spv::BuiltIn spvtools::val::Decoration::builtin() const");
    }
    operand = *(decoration->params_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
               ._M_impl.super__Vector_impl_data._M_start;
    SVar2 = GetStorageClass((anon_unknown_0 *)
                            (referenced_from_inst->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (Instruction *)(ulong)(referenced_from_inst->inst_).opcode);
    if ((SVar2 != Input) && (SVar2 != Max)) {
      lVar6 = 8;
      do {
        if (*(uint32_t *)((long)&UINT_008e5c18 + lVar6) == operand) {
          id = *(uint32_t *)((long)&(anonymous_namespace)::builtinVUIDInfo + lVar6);
          goto LAB_00608dc2;
        }
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0x288);
      id = 0;
LAB_00608dc2:
      ValidationState_t::diag
                ((DiagnosticStream *)local_208,this->_,SPV_ERROR_INVALID_DATA,referenced_from_inst);
      ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_290,this->_,id,(char *)0x0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)local_290._M_unused._0_8_,local_290._8_8_);
      spvLogStringForEnv_abi_cxx11_(&local_250,this->_->context_->target_env);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,
                 (char *)CONCAT44(local_250._M_dataplus._M_p._4_4_,
                                  (uint32_t)local_250._M_dataplus._M_p),local_250._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," spec allows BuiltIn ",0x15);
      local_270._0_8_ = (spv_operand_desc)0x0;
      sVar3 = AssemblyGrammar::lookupOperand
                        (&this->_->grammar_,SPV_OPERAND_TYPE_BUILT_IN,operand,
                         (spv_operand_desc *)local_270);
      if ((spv_operand_desc)local_270._0_8_ == (spv_operand_desc)0x0 || sVar3 != SPV_SUCCESS) {
        local_210 = "Unknown";
      }
      else {
        local_210 = *(char **)local_270._0_8_;
      }
      pDVar7 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,&local_210);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar7," to be only used for variables with Input storage class. ",0x39)
      ;
      (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                ((string *)local_270,this,decoration,built_in_inst,referenced_inst,
                 referenced_from_inst,ExecutionModelMax);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar7,(char *)local_270._0_8_,local_270._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar7," ",1);
      (anonymous_namespace)::BuiltInsValidator::GetStorageClassDesc_abi_cxx11_
                (&local_230,this,referenced_from_inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar7,local_230._M_dataplus._M_p,local_230._M_string_length);
      sVar3 = pDVar7->error_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((spv_operand_desc)local_270._0_8_ != (spv_operand_desc)(local_270 + 0x10)) {
        operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_250._M_dataplus._M_p._4_4_,(uint32_t)local_250._M_dataplus._M_p) !=
          &local_250.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_250._M_dataplus._M_p._4_4_,
                                 (uint32_t)local_250._M_dataplus._M_p),
                        local_250.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00609103;
    }
    for (p_Var4 = (this->execution_models_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(this->execution_models_)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      execution_model = p_Var4[1]._M_color;
      if (execution_model != 4) {
        lVar6 = 4;
        goto LAB_00608d9b;
      }
    }
  }
  if (this->function_id_ != 0) {
    return SPV_SUCCESS;
  }
  local_250._M_dataplus._M_p._0_4_ = (referenced_from_inst->inst_).result_id;
  __position = (list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
                *)std::
                  map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
                  ::operator[](&this->id_to_at_reference_checks_,(key_type_conflict *)&local_250);
  local_208._0_8_ = ValidateFullyCoveredAtReference;
  local_208._8_8_ = 0;
  std::
  _Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
  ::_Tuple_impl(&local_1f8,decoration,built_in_inst,referenced_from_inst,
                (_Placeholder<1> *)&std::placeholders::_1);
  local_290._8_8_ = 0;
  local_c0 = this;
  puVar5 = (undefined8 *)operator_new(0x150);
  *puVar5 = local_208._0_8_;
  puVar5[1] = local_208._8_8_;
  std::
  _Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
  ::_Tuple_impl((_Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                 *)(puVar5 + 2),&local_1f8);
  puVar5[0x29] = local_c0;
  local_278 = std::
              _Function_handler<spv_result_t_(const_spvtools::val::Instruction_&),_std::_Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>_>
              ::_M_invoke;
  local_280 = std::
              _Function_handler<spv_result_t_(const_spvtools::val::Instruction_&),_std::_Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>_>
              ::_M_manager;
  local_290._M_unused._M_object = puVar5;
  std::__cxx11::
  list<std::function<spv_result_t(spvtools::val::Instruction_const&)>,std::allocator<std::function<spv_result_t(spvtools::val::Instruction_const&)>>>
  ::_M_insert<std::function<spv_result_t(spvtools::val::Instruction_const&)>>
            (__position,(iterator)__position,
             (function<spv_result_t_(const_spvtools::val::Instruction_&)> *)&local_290);
  if (local_280 != (code *)0x0) {
    (*local_280)(&local_290,&local_290,3);
  }
  if (local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>._M_head_impl.params_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>._M_head_impl.
                    params_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                          _M_head_impl.params_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.super__Head_base<1UL,_spvtools::val::Decoration,_false>.
                          _M_head_impl.params_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1f8.
      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
      .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
      super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.
                    super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                    .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
                    super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          uses_.
                          super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          uses_.
                          super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1f8.
      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
      .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.operands_.
      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.
                    super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                    .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.operands_
                    .super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          operands_.
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          operands_.
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1f8.
      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
      .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.
                    super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                    .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<2UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1f8.
      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
      .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
      super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
      super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.
                    super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                    .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
                    super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.uses_.
                    super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          uses_.
                          super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          uses_.
                          super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1f8.
      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
      .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
      super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.operands_.
      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.
                    super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                    .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
                    super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.operands_.
                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          operands_.
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          operands_.
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1f8.
      super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
      .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
      super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.
                    super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                    .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>.
                    super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.words_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.
                          super__Tuple_impl<2UL,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Tuple_impl<3UL,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                          .super__Head_base<3UL,_spvtools::val::Instruction,_false>._M_head_impl.
                          words_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return SPV_SUCCESS;
  while (lVar6 = lVar6 + 0x10, lVar6 != 0x284) {
LAB_00608d9b:
    if (*(uint32_t *)((long)&UINT_008e5c1c + lVar6) == operand) {
      local_2a4 = *(uint32_t *)((long)&(anonymous_namespace)::builtinVUIDInfo + lVar6);
      goto LAB_00608f92;
    }
  }
  local_2a4 = 0;
LAB_00608f92:
  ValidationState_t::diag
            ((DiagnosticStream *)local_208,this->_,SPV_ERROR_INVALID_DATA,referenced_from_inst);
  ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_290,this->_,local_2a4,(char *)0x0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_208,(char *)local_290._M_unused._0_8_,local_290._8_8_);
  spvLogStringForEnv_abi_cxx11_(&local_250,this->_->context_->target_env);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_208,
             (char *)CONCAT44(local_250._M_dataplus._M_p._4_4_,(uint32_t)local_250._M_dataplus._M_p)
             ,local_250._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_208," spec allows BuiltIn ",0x15);
  local_270._0_8_ = (spv_operand_desc)0x0;
  sVar3 = AssemblyGrammar::lookupOperand
                    (&this->_->grammar_,SPV_OPERAND_TYPE_BUILT_IN,operand,
                     (spv_operand_desc *)local_270);
  if ((spv_operand_desc)local_270._0_8_ == (spv_operand_desc)0x0 || sVar3 != SPV_SUCCESS) {
    local_230._M_dataplus._M_p = "Unknown";
  }
  else {
    local_230._M_dataplus._M_p = *(pointer *)local_270._0_8_;
  }
  pDVar7 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_230);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pDVar7," to be used only with Fragment execution model. ",0x30);
  (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
            ((string *)local_270,this,decoration,built_in_inst,referenced_inst,referenced_from_inst,
             execution_model);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pDVar7,(char *)local_270._0_8_,local_270._8_8_);
  sVar3 = pDVar7->error_;
  if ((spv_operand_desc)local_270._0_8_ != (spv_operand_desc)(local_270 + 0x10)) {
    operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_250._M_dataplus._M_p._4_4_,(uint32_t)local_250._M_dataplus._M_p) !=
      &local_250.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_250._M_dataplus._M_p._4_4_,(uint32_t)local_250._M_dataplus._M_p),
                    local_250.field_2._M_allocated_capacity + 1);
  }
LAB_00609103:
  if ((code **)local_290._M_unused._0_8_ != &local_280) {
    operator_delete(local_290._M_unused._M_object,(ulong)(local_280 + 1));
  }
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
  return sVar3;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateFullyCoveredAtReference(
    const Decoration& decoration, const Instruction& built_in_inst,
    const Instruction& referenced_inst,
    const Instruction& referenced_from_inst) {

  if (spvIsVulkanEnv(_.context()->target_env)) {
    const spv::BuiltIn builtin = decoration.builtin();
    const spv::StorageClass storage_class = GetStorageClass(referenced_from_inst);
    if (storage_class != spv::StorageClass::Max &&
        storage_class != spv::StorageClass::Input) {
      uint32_t vuid = GetVUIDForBuiltin(builtin, VUIDErrorStorageClass);
      return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
             << _.VkErrorID(vuid) << spvLogStringForEnv(_.context()->target_env)
             << " spec allows BuiltIn "
             << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN, uint32_t(builtin))
             << " to be only used for variables with Input storage class. "
             << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                 referenced_from_inst)
             << " " << GetStorageClassDesc(referenced_from_inst);
    }

    for (const spv::ExecutionModel execution_model : execution_models_) {
      if (execution_model != spv::ExecutionModel::Fragment) {
        uint32_t vuid = GetVUIDForBuiltin(builtin, VUIDErrorExecutionModel);
        return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
               << _.VkErrorID(vuid)
               << spvLogStringForEnv(_.context()->target_env)
               << " spec allows BuiltIn "
               << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN, uint32_t(builtin))
               << " to be used only with Fragment execution model. "
               << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                   referenced_from_inst, execution_model);
      }
    }
  }

  if (function_id_ == 0) {
    // Propagate this rule to all dependant ids in the global scope.
    id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
        &BuiltInsValidator::ValidateFullyCoveredAtReference, this, decoration,
        built_in_inst, referenced_from_inst, std::placeholders::_1));
  }

  return SPV_SUCCESS;
}